

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

PointerType __thiscall capnp::_::PointerReader::getPointerType(PointerReader *this)

{
  bool bVar1;
  Kind KVar2;
  Fault local_58;
  Fault f_1;
  Fault local_40;
  Fault f;
  SegmentReader *local_30;
  SegmentReader *sgmt;
  word *refTarget;
  WirePointer *ptr;
  PointerReader *this_local;
  
  if ((this->pointer == (WirePointer *)0x0) ||
     (ptr = (WirePointer *)this, bVar1 = WirePointer::isNull(this->pointer), bVar1)) {
    this_local._4_4_ = NULL_;
  }
  else {
    refTarget = (word *)this->pointer;
    sgmt = (SegmentReader *)WirePointer::target((WirePointer *)refTarget,this->segment);
    local_30 = this->segment;
    f.exception = (Exception *)
                  WireHelpers::followFars((WirePointer **)&refTarget,(word *)sgmt,&local_30);
    bVar1 = kj::Maybe<const_capnp::word_&>::operator==((Maybe<const_capnp::word_&> *)&f,(void *)0x0)
    ;
    if (bVar1) {
      this_local._4_4_ = NULL_;
    }
    else {
      KVar2 = WirePointer::kind((WirePointer *)refTarget);
      switch(KVar2) {
      case STRUCT:
        this_local._4_4_ = STRUCT;
        break;
      case LIST:
        this_local._4_4_ = LIST;
        break;
      case FAR:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xaad,FAILED,(char *)0x0,"\"far pointer not followed?\"",
                   (char (*) [26])"far pointer not followed?");
        this_local._4_4_ = NULL_;
        kj::_::Debug::Fault::~Fault(&local_40);
        break;
      case OTHER:
        bVar1 = WirePointer::isCapability((WirePointer *)refTarget);
        if (bVar1) {
          this_local._4_4_ = CAPABILITY;
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                    (&local_58,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0xab3,FAILED,"ptr->isCapability()","\"unknown pointer type\"",
                     (char (*) [21])"unknown pointer type");
          this_local._4_4_ = NULL_;
          kj::_::Debug::Fault::~Fault(&local_58);
        }
        break;
      default:
        kj::_::unreachable();
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

PointerType PointerReader::getPointerType() const {
  if(pointer == nullptr || pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    const WirePointer* ptr = pointer;
    const word* refTarget = ptr->target(segment);
    SegmentReader* sgmt = segment;
    if (WireHelpers::followFars(ptr, refTarget, sgmt) == nullptr) return PointerType::NULL_;
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?") { return PointerType::NULL_; }
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type") { return PointerType::NULL_; }
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}